

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bicubic_pack4.h
# Opt level: O0

void ncnn::resize_bicubic_image_pack4
               (Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  undefined8 *puVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long in_RCX;
  float *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float *in_R8;
  long in_R9;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  __m128 _D;
  __m128 _rows3_4;
  __m128 _rows2_3;
  __m128 _rows1_2;
  __m128 _rows0_1;
  int dx_4;
  float *Dp;
  float *rows3p;
  float *rows2p;
  float *rows1p;
  float *rows0p;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1;
  __m128 _b0;
  __m128 _rows3_3;
  __m128 _rows2_2;
  __m128 _rows1_1;
  __m128 _rows0;
  __m128 _S33_3;
  __m128 _S32_3;
  __m128 _S31_3;
  __m128 _S30_3;
  __m128 _S23_2;
  __m128 _S22_2;
  __m128 _S21_2;
  __m128 _S20_2;
  __m128 _S13_1;
  __m128 _S12_1;
  __m128 _S11_1;
  __m128 _S10_1;
  __m128 _S03;
  __m128 _S02;
  __m128 _S01;
  __m128 _S00;
  __m128 _a3_3;
  __m128 _a2_3;
  __m128 _a1_3;
  __m128 _a0_3;
  float *S3p_3;
  float *S2p_2;
  float *S1p_1;
  float *S0p;
  int sx_3;
  int dx_3;
  float *rows3p_4;
  float *rows2p_3;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_3;
  float *S3_3;
  float *S2_2;
  float *S1_1;
  float *S0;
  __m128 _rows3_2;
  __m128 _rows2_1;
  __m128 _rows1;
  __m128 _S33_2;
  __m128 _S32_2;
  __m128 _S31_2;
  __m128 _S30_2;
  __m128 _S23_1;
  __m128 _S22_1;
  __m128 _S21_1;
  __m128 _S20_1;
  __m128 _S13;
  __m128 _S12;
  __m128 _S11;
  __m128 _S10;
  __m128 _a3_2;
  __m128 _a2_2;
  __m128 _a1_2;
  __m128 _a0_2;
  float *S3p_2;
  float *S2p_1;
  float *S1p;
  int sx_2;
  int dx_2;
  float *rows3p_3;
  float *rows2p_2;
  float *rows1p_1;
  float *alphap_2;
  float *S3_2;
  float *S2_1;
  float *S1;
  float *rows2_old;
  float *rows1_old_1;
  float *rows0_old_2;
  __m128 _rows3_1;
  __m128 _rows2;
  __m128 _S33_1;
  __m128 _S32_1;
  __m128 _S31_1;
  __m128 _S30_1;
  __m128 _S23;
  __m128 _S22;
  __m128 _S21;
  __m128 _S20;
  __m128 _a3_1;
  __m128 _a2_1;
  __m128 _a1_1;
  __m128 _a0_1;
  float *S3p_1;
  float *S2p;
  int sx_1;
  int dx_1;
  float *rows3p_2;
  float *rows2p_1;
  float *alphap_1;
  float *S3_1;
  float *S2;
  float *rows1_old;
  float *rows0_old_1;
  __m128 _rows3;
  __m128 _S33;
  __m128 _S32;
  __m128 _S31;
  __m128 _S30;
  __m128 _a3;
  __m128 _a2;
  __m128 _a1;
  __m128 _a0;
  float *S3p;
  int sx;
  int dx;
  float *rows3p_1;
  float *alphap;
  float *S3;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows3;
  float *rows2;
  float *rows1;
  float *rows0;
  Mat rowsbuf3;
  Mat rowsbuf2;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_ffffffffffffde40;
  undefined8 in_stack_ffffffffffffde48;
  int iVar41;
  undefined8 **ppuVar40;
  size_t in_stack_ffffffffffffde50;
  undefined8 in_stack_ffffffffffffde58;
  int iVar42;
  Mat *in_stack_ffffffffffffde60;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  int local_1f14;
  undefined8 *local_1f10;
  undefined8 *local_1f08;
  undefined8 *local_1f00;
  undefined8 *local_1ef8;
  undefined8 *local_1ef0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  int local_1d04;
  float *local_1ce0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  int local_1b6c;
  float *local_1b50;
  undefined8 local_1b18;
  undefined8 uStack_1b10;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  int local_1a24;
  float *local_1a10;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  int local_1944;
  float *local_1938;
  int local_1918;
  int local_1914;
  undefined8 *local_1910;
  undefined8 *local_1908;
  undefined8 *local_1900;
  undefined8 *local_18f8;
  undefined8 *local_18f0;
  int *local_18e8;
  undefined8 local_18e0;
  undefined4 local_18d8;
  long *local_18d0;
  undefined4 local_18c8;
  undefined4 local_18c4;
  undefined4 local_18c0;
  undefined4 local_18bc;
  undefined4 local_18b8;
  undefined8 local_18b0;
  undefined8 *local_18a8;
  int *local_18a0;
  undefined8 local_1898;
  undefined4 local_1890;
  long *local_1888;
  undefined4 local_1880;
  undefined4 local_187c;
  undefined4 local_1878;
  undefined4 local_1874;
  undefined4 local_1870;
  undefined8 local_1868;
  undefined8 *local_1850;
  int *local_1848;
  undefined8 local_1840;
  undefined4 local_1838;
  long *local_1830;
  undefined4 local_1828;
  undefined4 local_1824;
  undefined4 local_1820;
  undefined4 local_181c;
  undefined4 local_1818;
  undefined8 local_1810;
  undefined8 *local_1808;
  int *local_1800;
  undefined8 local_17f8;
  undefined4 local_17f0;
  long *local_17e8;
  undefined4 local_17e0;
  undefined4 local_17dc;
  undefined4 local_17d8;
  undefined4 local_17d4;
  undefined4 local_17d0;
  undefined8 local_17c8;
  int local_17c0;
  int local_17bc;
  long local_17b8;
  float *local_17b0;
  long local_17a8;
  float *local_17a0;
  long *local_1798;
  long *local_1790;
  undefined8 **local_1788;
  undefined8 **local_1778;
  undefined8 **local_1768;
  undefined8 **local_1758;
  undefined8 *local_1748;
  undefined8 *local_1740;
  undefined8 *local_1738;
  undefined8 *local_1730;
  undefined8 *local_1728;
  undefined8 *local_1720;
  undefined8 *local_1718;
  undefined8 *local_1710;
  undefined8 *local_1708;
  undefined8 *local_1700;
  undefined8 *local_16f8;
  undefined8 *local_16f0;
  undefined8 *local_16e8;
  undefined8 *local_16e0;
  undefined8 *local_16d8;
  undefined8 *local_16d0;
  undefined8 *local_16c8;
  undefined8 *local_16c0;
  undefined8 *local_16b8;
  undefined8 *local_16b0;
  undefined8 *local_16a8;
  undefined8 *local_16a0;
  undefined8 *local_1698;
  undefined8 *local_1690;
  undefined8 *local_1688;
  undefined8 *local_1680;
  undefined8 *local_1678;
  undefined8 *local_1670;
  undefined8 *local_1668;
  undefined8 *local_1660;
  undefined8 *local_1658;
  undefined8 *local_1650;
  undefined8 *local_1648;
  undefined8 *local_1640;
  undefined8 *local_1638;
  undefined8 *local_1630;
  undefined8 *local_1628;
  undefined8 *local_1620;
  undefined8 *local_1618;
  undefined8 *local_1610;
  undefined8 *local_1608;
  undefined8 *local_1600;
  undefined8 *local_15f8;
  undefined8 *local_15f0;
  int local_15e4;
  long *local_15e0;
  int local_15d4;
  long *local_15d0;
  int local_15c4;
  long *local_15c0;
  int local_15b4;
  long *local_15b0;
  int local_15a4;
  long *local_15a0;
  int local_1594;
  long *local_1590;
  int local_1584;
  long *local_1580;
  int local_1574;
  long *local_1570;
  int local_1564;
  long *local_1560;
  int local_1554;
  long *local_1550;
  int local_1544;
  long *local_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 *local_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 *local_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 *local_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 *local_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 *local_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 *local_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 *local_1460;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 *local_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 *local_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 *local_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 *local_13e0;
  float local_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float local_13bc;
  float local_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float local_139c;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float local_137c;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float local_135c;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float local_133c;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_131c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float local_12fc;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float local_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float local_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float local_129c;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float local_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float local_123c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float local_121c;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float local_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float local_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_115c;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  int local_598;
  undefined4 local_594;
  undefined8 **local_590;
  int local_578;
  undefined4 local_574;
  undefined8 **local_570;
  int local_558;
  undefined4 local_554;
  undefined8 **local_550;
  int local_538;
  undefined4 local_534;
  undefined8 **local_530;
  undefined8 *local_528;
  undefined8 *local_518;
  undefined8 *local_508;
  undefined8 *local_4f8;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined1 local_498 [16];
  undefined8 local_488;
  undefined8 uStack_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined8 local_c0;
  undefined4 local_b4;
  undefined8 local_b0;
  int local_a4;
  undefined8 **local_a0;
  undefined8 local_98;
  undefined4 local_8c;
  undefined8 local_88;
  int local_7c;
  undefined8 **local_78;
  undefined8 local_70;
  undefined4 local_64;
  undefined8 local_60;
  int local_54;
  undefined8 **local_50;
  undefined8 local_48;
  undefined4 local_3c;
  undefined8 local_38;
  int local_2c;
  undefined8 **local_28;
  undefined8 **local_20;
  undefined8 **local_18;
  undefined8 **local_10;
  undefined8 **local_8;
  
  iVar42 = (int)((ulong)in_stack_ffffffffffffde58 >> 0x20);
  iVar41 = (int)((ulong)in_stack_ffffffffffffde48 >> 0x20);
  local_17bc = *(int *)((long)in_RSI + 0x2c);
  local_17c0 = (int)in_RSI[6];
  local_a0 = &local_1808;
  local_b0 = 0x10;
  local_b4 = 4;
  local_c0 = 0;
  local_1808 = (undefined8 *)0x0;
  local_1800 = (int *)0x0;
  local_17f8 = 0;
  local_17f0 = 0;
  local_17e8 = (long *)0x0;
  local_17e0 = 0;
  local_17dc = 0;
  local_17d8 = 0;
  local_17d4 = 0;
  local_17d0 = 0;
  local_17c8 = 0;
  local_17b8 = in_R9;
  local_17b0 = in_R8;
  local_17a8 = in_RCX;
  local_17a0 = in_RDX;
  local_1798 = in_RSI;
  local_1790 = in_RDI;
  local_a4 = local_17bc;
  Mat::create(in_stack_ffffffffffffde60,iVar42,in_stack_ffffffffffffde50,iVar41,
              in_stack_ffffffffffffde40);
  local_78 = &local_1850;
  local_7c = local_17bc;
  local_88 = 0x10;
  local_8c = 4;
  local_98 = 0;
  local_1850 = (undefined8 *)0x0;
  local_1848 = (int *)0x0;
  local_1840 = 0;
  local_1838 = 0;
  local_1830 = (long *)0x0;
  local_1828 = 0;
  local_1824 = 0;
  local_1820 = 0;
  local_181c = 0;
  local_1818 = 0;
  local_1810 = 0;
  Mat::create(in_stack_ffffffffffffde60,iVar42,in_stack_ffffffffffffde50,iVar41,
              in_stack_ffffffffffffde40);
  local_50 = &local_18a8;
  local_54 = local_17bc;
  local_60 = 0x10;
  local_64 = 4;
  local_70 = 0;
  local_18a8 = (undefined8 *)0x0;
  local_18a0 = (int *)0x0;
  local_1898 = 0;
  local_1890 = 0;
  local_1888 = (long *)0x0;
  local_1880 = 0;
  local_187c = 0;
  local_1878 = 0;
  local_1874 = 0;
  local_1870 = 0;
  local_1868 = 0;
  Mat::create(in_stack_ffffffffffffde60,iVar42,in_stack_ffffffffffffde50,iVar41,
              in_stack_ffffffffffffde40);
  local_28 = &local_18f0;
  local_2c = local_17bc;
  local_38 = 0x10;
  local_3c = 4;
  local_48 = 0;
  local_18f0 = (undefined8 *)0x0;
  local_18e8 = (int *)0x0;
  local_18e0 = 0;
  local_18d8 = 0;
  local_18d0 = (long *)0x0;
  local_18c8 = 0;
  local_18c4 = 0;
  local_18c0 = 0;
  local_18bc = 0;
  local_18b8 = 0;
  local_18b0 = 0;
  Mat::create(in_stack_ffffffffffffde60,iVar42,in_stack_ffffffffffffde50,iVar41,
              in_stack_ffffffffffffde40);
  local_8 = &local_1808;
  local_18f8 = local_1808;
  local_10 = &local_1850;
  local_1900 = local_1850;
  local_18 = &local_18a8;
  local_1908 = local_18a8;
  local_20 = &local_18f0;
  local_1910 = local_18f0;
  local_1914 = -3;
  for (local_1918 = 0; puVar20 = local_18f8, puVar19 = local_1900, puVar18 = local_1908,
      local_1918 < local_17c0; local_1918 = local_1918 + 1) {
    iVar41 = *(int *)(local_17b8 + (long)local_1918 * 4);
    if (iVar41 != local_1914) {
      if (iVar41 == local_1914 + 1) {
        local_18f8 = local_1900;
        local_1900 = local_1908;
        local_1908 = local_1910;
        local_1910 = puVar20;
        local_1554 = iVar41 + 2;
        local_1550 = local_1790;
        lVar2 = *local_1790;
        iVar42 = *(int *)((long)local_1790 + 0x2c);
        lVar3 = local_1790[2];
        local_1938 = local_17a0;
        for (local_1944 = 0; local_1944 < local_17bc; local_1944 = local_1944 + 1) {
          local_15f8 = (undefined8 *)
                       (lVar2 + (long)iVar42 * (long)local_1554 * lVar3 +
                       (long)(*(int *)(local_17a8 + (long)local_1944 * 4) << 2) * 4);
          local_1178 = *local_1938;
          local_1018 = CONCAT44(local_1178,local_1178);
          uStack_1010 = CONCAT44(local_1178,local_1178);
          local_1198 = local_1938[1];
          local_5e8 = CONCAT44(local_1198,local_1198);
          uStack_5e0 = CONCAT44(local_1198,local_1198);
          local_11b8 = local_1938[2];
          local_638 = CONCAT44(local_11b8,local_11b8);
          uStack_630 = CONCAT44(local_11b8,local_11b8);
          local_11d8 = local_1938[3];
          local_688 = CONCAT44(local_11d8,local_11d8);
          uStack_680 = CONCAT44(local_11d8,local_11d8);
          local_15f0 = local_15f8 + -2;
          uVar10 = *local_15f0;
          uVar11 = local_15f8[-1];
          local_5d8 = *local_15f8;
          uStack_5d0 = local_15f8[1];
          local_1600 = local_15f8 + 2;
          local_628 = *local_1600;
          uStack_620 = local_15f8[3];
          local_1608 = local_15f8 + 4;
          local_678 = *local_1608;
          uStack_670 = local_15f8[5];
          local_1008._0_4_ = (float)uVar10;
          local_1008._4_4_ = (float)((ulong)uVar10 >> 0x20);
          uStack_1000._0_4_ = (float)uVar11;
          uStack_1000._4_4_ = (float)((ulong)uVar11 >> 0x20);
          local_19e8 = CONCAT44(local_1008._4_4_ * local_1178,(float)local_1008 * local_1178);
          uStack_19e0 = CONCAT44(uStack_1000._4_4_ * local_1178,(float)uStack_1000 * local_1178);
          local_5f8 = local_19e8;
          uStack_5f0 = uStack_19e0;
          local_5b8._0_4_ = (float)local_5d8;
          local_5b8._4_4_ = (float)((ulong)local_5d8 >> 0x20);
          uStack_5b0._0_4_ = (float)uStack_5d0;
          uStack_5b0._4_4_ = (float)((ulong)uStack_5d0 >> 0x20);
          local_4d8 = (float)local_5b8 * local_1198;
          fStack_4d4 = local_5b8._4_4_ * local_1198;
          fStack_4d0 = (float)uStack_5b0 * local_1198;
          fStack_4cc = uStack_5b0._4_4_ * local_1198;
          local_4e8 = local_19e8;
          uStack_4e0 = uStack_19e0;
          fVar24 = local_4d8 + (float)local_1008 * local_1178;
          fVar25 = fStack_4d4 + local_1008._4_4_ * local_1178;
          fVar29 = fStack_4d0 + (float)uStack_1000 * local_1178;
          fVar39 = fStack_4cc + uStack_1000._4_4_ * local_1178;
          local_648 = CONCAT44(fVar25,fVar24);
          uStack_640 = CONCAT44(fVar39,fVar29);
          local_608._0_4_ = (float)local_628;
          local_608._4_4_ = (float)((ulong)local_628 >> 0x20);
          uStack_600._0_4_ = (float)uStack_620;
          uStack_600._4_4_ = (float)((ulong)uStack_620 >> 0x20);
          local_4b8 = (float)local_608 * local_11b8;
          fStack_4b4 = local_608._4_4_ * local_11b8;
          fStack_4b0 = (float)uStack_600 * local_11b8;
          fStack_4ac = uStack_600._4_4_ * local_11b8;
          fVar24 = local_4b8 + fVar24;
          fVar25 = fStack_4b4 + fVar25;
          fVar29 = fStack_4b0 + fVar29;
          fVar39 = fStack_4ac + fVar39;
          local_698 = CONCAT44(fVar25,fVar24);
          uStack_690 = CONCAT44(fVar39,fVar29);
          local_658._0_4_ = (float)local_678;
          local_658._4_4_ = (float)((ulong)local_678 >> 0x20);
          uStack_650._0_4_ = (float)uStack_670;
          uStack_650._4_4_ = (float)((ulong)uStack_670 >> 0x20);
          local_498._0_4_ = (float)local_658 * local_11d8;
          local_498._4_4_ = local_658._4_4_ * local_11d8;
          local_498._8_4_ = (float)uStack_650 * local_11d8;
          local_498._12_4_ = uStack_650._4_4_ * local_11d8;
          local_13f8 = CONCAT44(local_498._4_4_ + fVar25,local_498._0_4_ + fVar24);
          uStack_13f0 = CONCAT44(local_498._12_4_ + fVar39,local_498._8_4_ + fVar29);
          local_13e0 = (undefined8 *)((long)puVar20 + (long)(local_1944 << 2) * 4);
          *local_13e0 = local_13f8;
          local_13e0[1] = uStack_13f0;
          local_1938 = local_1938 + 4;
          fStack_11d4 = local_11d8;
          fStack_11d0 = local_11d8;
          fStack_11cc = local_11d8;
          local_11bc = local_11d8;
          fStack_11b4 = local_11b8;
          fStack_11b0 = local_11b8;
          fStack_11ac = local_11b8;
          local_119c = local_11b8;
          fStack_1194 = local_1198;
          fStack_1190 = local_1198;
          fStack_118c = local_1198;
          local_117c = local_1198;
          fStack_1174 = local_1178;
          fStack_1170 = local_1178;
          fStack_116c = local_1178;
          local_115c = local_1178;
          local_1008 = uVar10;
          uStack_1000 = uVar11;
          local_668 = local_688;
          uStack_660 = uStack_680;
          local_658 = local_678;
          uStack_650 = uStack_670;
          local_618 = local_638;
          uStack_610 = uStack_630;
          local_608 = local_628;
          uStack_600 = uStack_620;
          local_5c8 = local_5e8;
          uStack_5c0 = uStack_5e0;
          local_5b8 = local_5d8;
          uStack_5b0 = uStack_5d0;
          local_4c8 = local_648;
          uStack_4c0 = uStack_640;
          local_4a8 = local_698;
          uStack_4a0 = uStack_690;
        }
      }
      else if (iVar41 == local_1914 + 2) {
        local_18f8 = local_1908;
        local_1900 = local_1910;
        local_1908 = puVar20;
        local_1910 = puVar19;
        local_1564 = iVar41 + 1;
        local_1560 = local_1790;
        lVar2 = *local_1790;
        iVar42 = *(int *)((long)local_1790 + 0x2c);
        lVar3 = local_1790[2];
        local_1574 = iVar41 + 2;
        local_1570 = local_1790;
        lVar4 = *local_1790;
        iVar1 = *(int *)((long)local_1790 + 0x2c);
        lVar5 = local_1790[2];
        local_1a10 = local_17a0;
        for (local_1a24 = 0; local_1a24 < local_17bc; local_1a24 = local_1a24 + 1) {
          iVar21 = *(int *)(local_17a8 + (long)local_1a24 * 4) << 2;
          local_1618 = (undefined8 *)
                       (lVar2 + (long)iVar42 * (long)local_1564 * lVar3 + (long)iVar21 * 4);
          local_1638 = (undefined8 *)
                       (lVar4 + (long)iVar1 * (long)local_1574 * lVar5 + (long)iVar21 * 4);
          local_11f8 = *local_1a10;
          local_1058 = CONCAT44(local_11f8,local_11f8);
          uStack_1050 = CONCAT44(local_11f8,local_11f8);
          local_1218 = local_1a10[1];
          local_728 = CONCAT44(local_1218,local_1218);
          uStack_720 = CONCAT44(local_1218,local_1218);
          local_1238 = local_1a10[2];
          local_7c8 = CONCAT44(local_1238,local_1238);
          uStack_7c0 = CONCAT44(local_1238,local_1238);
          local_1258 = local_1a10[3];
          local_868 = CONCAT44(local_1258,local_1258);
          uStack_860 = CONCAT44(local_1258,local_1258);
          local_1610 = local_1618 + -2;
          uVar10 = *local_1610;
          uVar11 = local_1618[-1];
          local_6c8 = *local_1618;
          uStack_6c0 = local_1618[1];
          local_1620 = local_1618 + 2;
          local_768 = *local_1620;
          uStack_760 = local_1618[3];
          local_1628 = local_1618 + 4;
          local_808 = *local_1628;
          uStack_800 = local_1618[5];
          local_1630 = local_1638 + -2;
          uVar12 = *local_1630;
          uVar13 = local_1638[-1];
          local_718 = *local_1638;
          uStack_710 = local_1638[1];
          local_1640 = local_1638 + 2;
          local_7b8 = *local_1640;
          uStack_7b0 = local_1638[3];
          local_1648 = local_1638 + 4;
          local_858 = *local_1648;
          uStack_850 = local_1638[5];
          local_1028._0_4_ = (float)uVar10;
          local_1028._4_4_ = (float)((ulong)uVar10 >> 0x20);
          uStack_1020._0_4_ = (float)uVar11;
          uStack_1020._4_4_ = (float)((ulong)uVar11 >> 0x20);
          local_1b08 = CONCAT44(local_1028._4_4_ * local_11f8,(float)local_1028 * local_11f8);
          uStack_1b00 = CONCAT44(uStack_1020._4_4_ * local_11f8,(float)uStack_1020 * local_11f8);
          local_1048._0_4_ = (float)uVar12;
          local_1048._4_4_ = (float)((ulong)uVar12 >> 0x20);
          uStack_1040._0_4_ = (float)uVar13;
          uStack_1040._4_4_ = (float)((ulong)uVar13 >> 0x20);
          local_1b18 = CONCAT44(local_1048._4_4_ * local_11f8,(float)local_1048 * local_11f8);
          uStack_1b10 = CONCAT44(uStack_1040._4_4_ * local_11f8,(float)uStack_1040 * local_11f8);
          local_6e8 = local_1b08;
          uStack_6e0 = uStack_1b00;
          local_6a8._0_4_ = (float)local_6c8;
          local_6a8._4_4_ = (float)((ulong)local_6c8 >> 0x20);
          uStack_6a0._0_4_ = (float)uStack_6c0;
          uStack_6a0._4_4_ = (float)((ulong)uStack_6c0 >> 0x20);
          local_478 = (float)local_6a8 * local_1218;
          fStack_474 = local_6a8._4_4_ * local_1218;
          fStack_470 = (float)uStack_6a0 * local_1218;
          fStack_46c = uStack_6a0._4_4_ * local_1218;
          local_488 = local_1b08;
          uStack_480 = uStack_1b00;
          fVar24 = local_478 + (float)local_1028 * local_11f8;
          fVar29 = fStack_474 + local_1028._4_4_ * local_11f8;
          fVar26 = fStack_470 + (float)uStack_1020 * local_11f8;
          fVar30 = fStack_46c + uStack_1020._4_4_ * local_11f8;
          local_788 = CONCAT44(fVar29,fVar24);
          uStack_780 = CONCAT44(fVar30,fVar26);
          local_738 = local_1b18;
          uStack_730 = uStack_1b10;
          local_6f8._0_4_ = (float)local_718;
          local_6f8._4_4_ = (float)((ulong)local_718 >> 0x20);
          uStack_6f0._0_4_ = (float)uStack_710;
          uStack_6f0._4_4_ = (float)((ulong)uStack_710 >> 0x20);
          local_458 = (float)local_6f8 * local_1218;
          fStack_454 = local_6f8._4_4_ * local_1218;
          fStack_450 = (float)uStack_6f0 * local_1218;
          fStack_44c = uStack_6f0._4_4_ * local_1218;
          local_468 = local_1b18;
          uStack_460 = uStack_1b10;
          fVar25 = local_458 + (float)local_1048 * local_11f8;
          fVar39 = fStack_454 + local_1048._4_4_ * local_11f8;
          fVar27 = fStack_450 + (float)uStack_1040 * local_11f8;
          fVar31 = fStack_44c + uStack_1040._4_4_ * local_11f8;
          local_7d8 = CONCAT44(fVar39,fVar25);
          uStack_7d0 = CONCAT44(fVar31,fVar27);
          local_748._0_4_ = (float)local_768;
          local_748._4_4_ = (float)((ulong)local_768 >> 0x20);
          uStack_740._0_4_ = (float)uStack_760;
          uStack_740._4_4_ = (float)((ulong)uStack_760 >> 0x20);
          local_438 = (float)local_748 * local_1238;
          fStack_434 = local_748._4_4_ * local_1238;
          fStack_430 = (float)uStack_740 * local_1238;
          fStack_42c = uStack_740._4_4_ * local_1238;
          fVar24 = local_438 + fVar24;
          fVar29 = fStack_434 + fVar29;
          fVar26 = fStack_430 + fVar26;
          fVar30 = fStack_42c + fVar30;
          local_828 = CONCAT44(fVar29,fVar24);
          uStack_820 = CONCAT44(fVar30,fVar26);
          local_798._0_4_ = (float)local_7b8;
          local_798._4_4_ = (float)((ulong)local_7b8 >> 0x20);
          uStack_790._0_4_ = (float)uStack_7b0;
          uStack_790._4_4_ = (float)((ulong)uStack_7b0 >> 0x20);
          local_418 = (float)local_798 * local_1238;
          fStack_414 = local_798._4_4_ * local_1238;
          fStack_410 = (float)uStack_790 * local_1238;
          fStack_40c = uStack_790._4_4_ * local_1238;
          fVar25 = local_418 + fVar25;
          fVar39 = fStack_414 + fVar39;
          fVar27 = fStack_410 + fVar27;
          fVar31 = fStack_40c + fVar31;
          local_878 = CONCAT44(fVar39,fVar25);
          uStack_870 = CONCAT44(fVar31,fVar27);
          local_7e8._0_4_ = (float)local_808;
          local_7e8._4_4_ = (float)((ulong)local_808 >> 0x20);
          uStack_7e0._0_4_ = (float)uStack_800;
          uStack_7e0._4_4_ = (float)((ulong)uStack_800 >> 0x20);
          local_3f8 = (float)local_7e8 * local_1258;
          fStack_3f4 = local_7e8._4_4_ * local_1258;
          fStack_3f0 = (float)uStack_7e0 * local_1258;
          fStack_3ec = uStack_7e0._4_4_ * local_1258;
          local_1418 = CONCAT44(fStack_3f4 + fVar29,local_3f8 + fVar24);
          uStack_1410 = CONCAT44(fStack_3ec + fVar30,fStack_3f0 + fVar26);
          local_838._0_4_ = (float)local_858;
          local_838._4_4_ = (float)((ulong)local_858 >> 0x20);
          uStack_830._0_4_ = (float)uStack_850;
          uStack_830._4_4_ = (float)((ulong)uStack_850 >> 0x20);
          local_3d8._0_4_ = (float)local_838 * local_1258;
          local_3d8._4_4_ = local_838._4_4_ * local_1258;
          local_3d8._8_4_ = (float)uStack_830 * local_1258;
          local_3d8._12_4_ = uStack_830._4_4_ * local_1258;
          local_1438 = CONCAT44(local_3d8._4_4_ + fVar39,local_3d8._0_4_ + fVar25);
          uStack_1430 = CONCAT44(local_3d8._12_4_ + fVar31,local_3d8._8_4_ + fVar27);
          local_1400 = (undefined8 *)((long)puVar20 + (long)(local_1a24 << 2) * 4);
          *local_1400 = local_1418;
          local_1400[1] = uStack_1410;
          local_1420 = (undefined8 *)((long)puVar19 + (long)(local_1a24 << 2) * 4);
          *local_1420 = local_1438;
          local_1420[1] = uStack_1430;
          local_1a10 = local_1a10 + 4;
          fStack_1254 = local_1258;
          fStack_1250 = local_1258;
          fStack_124c = local_1258;
          local_123c = local_1258;
          fStack_1234 = local_1238;
          fStack_1230 = local_1238;
          fStack_122c = local_1238;
          local_121c = local_1238;
          fStack_1214 = local_1218;
          fStack_1210 = local_1218;
          fStack_120c = local_1218;
          local_11fc = local_1218;
          fStack_11f4 = local_11f8;
          fStack_11f0 = local_11f8;
          fStack_11ec = local_11f8;
          local_11dc = local_11f8;
          local_1048 = uVar12;
          uStack_1040 = uVar13;
          local_1038 = local_1058;
          uStack_1030 = uStack_1050;
          local_1028 = uVar10;
          uStack_1020 = uVar11;
          local_848 = local_868;
          uStack_840 = uStack_860;
          local_838 = local_858;
          uStack_830 = uStack_850;
          local_818 = local_868;
          uStack_810 = uStack_860;
          local_7f8 = local_868;
          uStack_7f0 = uStack_860;
          local_7e8 = local_808;
          uStack_7e0 = uStack_800;
          local_7a8 = local_7c8;
          uStack_7a0 = uStack_7c0;
          local_798 = local_7b8;
          uStack_790 = uStack_7b0;
          local_778 = local_7c8;
          uStack_770 = uStack_7c0;
          local_758 = local_7c8;
          uStack_750 = uStack_7c0;
          local_748 = local_768;
          uStack_740 = uStack_760;
          local_708 = local_728;
          uStack_700 = uStack_720;
          local_6f8 = local_718;
          uStack_6f0 = uStack_710;
          local_6d8 = local_728;
          uStack_6d0 = uStack_720;
          local_6b8 = local_728;
          uStack_6b0 = uStack_720;
          local_6a8 = local_6c8;
          uStack_6a0 = uStack_6c0;
          local_448 = local_788;
          uStack_440 = uStack_780;
          local_428 = local_7d8;
          uStack_420 = uStack_7d0;
          local_408 = local_828;
          uStack_400 = uStack_820;
          local_3e8 = local_878;
          uStack_3e0 = uStack_870;
        }
      }
      else if (iVar41 == local_1914 + 3) {
        local_18f8 = local_1910;
        local_1900 = puVar20;
        local_1908 = puVar19;
        local_1910 = puVar18;
        local_1580 = local_1790;
        lVar2 = *local_1790;
        iVar42 = *(int *)((long)local_1790 + 0x2c);
        lVar3 = local_1790[2];
        local_1594 = iVar41 + 1;
        local_1590 = local_1790;
        lVar4 = *local_1790;
        iVar1 = *(int *)((long)local_1790 + 0x2c);
        lVar5 = local_1790[2];
        local_15a4 = iVar41 + 2;
        local_15a0 = local_1790;
        lVar6 = *local_1790;
        iVar21 = *(int *)((long)local_1790 + 0x2c);
        lVar7 = local_1790[2];
        local_1b50 = local_17a0;
        for (local_1b6c = 0; local_1584 = iVar41, local_1b6c < local_17bc;
            local_1b6c = local_1b6c + 1) {
          iVar22 = *(int *)(local_17a8 + (long)local_1b6c * 4) << 2;
          local_1658 = (undefined8 *)
                       (lVar2 + (long)iVar42 * (long)iVar41 * lVar3 + (long)iVar22 * 4);
          local_1678 = (undefined8 *)
                       (lVar4 + (long)iVar1 * (long)local_1594 * lVar5 + (long)iVar22 * 4);
          local_1698 = (undefined8 *)
                       (lVar6 + (long)iVar21 * (long)local_15a4 * lVar7 + (long)iVar22 * 4);
          local_1278 = *local_1b50;
          local_10b8 = CONCAT44(local_1278,local_1278);
          uStack_10b0 = CONCAT44(local_1278,local_1278);
          local_1298 = local_1b50[1];
          local_958 = CONCAT44(local_1298,local_1298);
          uStack_950 = CONCAT44(local_1298,local_1298);
          local_12b8 = local_1b50[2];
          local_a48 = CONCAT44(local_12b8,local_12b8);
          uStack_a40 = CONCAT44(local_12b8,local_12b8);
          local_12d8 = local_1b50[3];
          local_b38 = CONCAT44(local_12d8,local_12d8);
          uStack_b30 = CONCAT44(local_12d8,local_12d8);
          local_1650 = local_1658 + -2;
          uVar10 = *local_1650;
          uVar11 = local_1658[-1];
          local_8a8 = *local_1658;
          uStack_8a0 = local_1658[1];
          local_1660 = local_1658 + 2;
          local_998 = *local_1660;
          uStack_990 = local_1658[3];
          local_1668 = local_1658 + 4;
          local_a88 = *local_1668;
          uStack_a80 = local_1658[5];
          local_1670 = local_1678 + -2;
          uVar12 = *local_1670;
          uVar13 = local_1678[-1];
          local_8f8 = *local_1678;
          uStack_8f0 = local_1678[1];
          local_1680 = local_1678 + 2;
          local_9e8 = *local_1680;
          uStack_9e0 = local_1678[3];
          local_1688 = local_1678 + 4;
          local_ad8 = *local_1688;
          uStack_ad0 = local_1678[5];
          local_1690 = local_1698 + -2;
          uVar14 = *local_1690;
          uVar15 = local_1698[-1];
          local_948 = *local_1698;
          uStack_940 = local_1698[1];
          local_16a0 = local_1698 + 2;
          local_a38 = *local_16a0;
          uStack_a30 = local_1698[3];
          local_16a8 = local_1698 + 4;
          local_b28 = *local_16a8;
          uStack_b20 = local_1698[5];
          local_1068._0_4_ = (float)uVar10;
          local_1068._4_4_ = (float)((ulong)uVar10 >> 0x20);
          uStack_1060._0_4_ = (float)uVar11;
          uStack_1060._4_4_ = (float)((ulong)uVar11 >> 0x20);
          local_1c98 = CONCAT44(local_1068._4_4_ * local_1278,(float)local_1068 * local_1278);
          uStack_1c90 = CONCAT44(uStack_1060._4_4_ * local_1278,(float)uStack_1060 * local_1278);
          local_1088._0_4_ = (float)uVar12;
          local_1088._4_4_ = (float)((ulong)uVar12 >> 0x20);
          uStack_1080._0_4_ = (float)uVar13;
          uStack_1080._4_4_ = (float)((ulong)uVar13 >> 0x20);
          local_1ca8 = CONCAT44(local_1088._4_4_ * local_1278,(float)local_1088 * local_1278);
          uStack_1ca0 = CONCAT44(uStack_1080._4_4_ * local_1278,(float)uStack_1080 * local_1278);
          local_10a8._0_4_ = (float)uVar14;
          local_10a8._4_4_ = (float)((ulong)uVar14 >> 0x20);
          uStack_10a0._0_4_ = (float)uVar15;
          uStack_10a0._4_4_ = (float)((ulong)uVar15 >> 0x20);
          local_1cb8 = CONCAT44(local_10a8._4_4_ * local_1278,(float)local_10a8 * local_1278);
          uStack_1cb0 = CONCAT44(uStack_10a0._4_4_ * local_1278,(float)uStack_10a0 * local_1278);
          local_8c8 = local_1c98;
          uStack_8c0 = uStack_1c90;
          local_888._0_4_ = (float)local_8a8;
          local_888._4_4_ = (float)((ulong)local_8a8 >> 0x20);
          uStack_880._0_4_ = (float)uStack_8a0;
          uStack_880._4_4_ = (float)((ulong)uStack_8a0 >> 0x20);
          local_3b8 = (float)local_888 * local_1298;
          fStack_3b4 = local_888._4_4_ * local_1298;
          fStack_3b0 = (float)uStack_880 * local_1298;
          fStack_3ac = uStack_880._4_4_ * local_1298;
          local_3c8 = local_1c98;
          uStack_3c0 = uStack_1c90;
          fVar24 = local_3b8 + (float)local_1068 * local_1278;
          fVar39 = fStack_3b4 + local_1068._4_4_ * local_1278;
          fVar30 = fStack_3b0 + (float)uStack_1060 * local_1278;
          fVar32 = fStack_3ac + uStack_1060._4_4_ * local_1278;
          local_9b8 = CONCAT44(fVar39,fVar24);
          uStack_9b0 = CONCAT44(fVar32,fVar30);
          local_918 = local_1ca8;
          uStack_910 = uStack_1ca0;
          local_8d8._0_4_ = (float)local_8f8;
          local_8d8._4_4_ = (float)((ulong)local_8f8 >> 0x20);
          uStack_8d0._0_4_ = (float)uStack_8f0;
          uStack_8d0._4_4_ = (float)((ulong)uStack_8f0 >> 0x20);
          local_398 = (float)local_8d8 * local_1298;
          fStack_394 = local_8d8._4_4_ * local_1298;
          fStack_390 = (float)uStack_8d0 * local_1298;
          fStack_38c = uStack_8d0._4_4_ * local_1298;
          local_3a8 = local_1ca8;
          uStack_3a0 = uStack_1ca0;
          fVar25 = local_398 + (float)local_1088 * local_1278;
          fVar26 = fStack_394 + local_1088._4_4_ * local_1278;
          fVar31 = fStack_390 + (float)uStack_1080 * local_1278;
          fVar33 = fStack_38c + uStack_1080._4_4_ * local_1278;
          local_a08 = CONCAT44(fVar26,fVar25);
          uStack_a00 = CONCAT44(fVar33,fVar31);
          local_968 = local_1cb8;
          uStack_960 = uStack_1cb0;
          local_928._0_4_ = (float)local_948;
          local_928._4_4_ = (float)((ulong)local_948 >> 0x20);
          uStack_920._0_4_ = (float)uStack_940;
          uStack_920._4_4_ = (float)((ulong)uStack_940 >> 0x20);
          local_378 = (float)local_928 * local_1298;
          fStack_374 = local_928._4_4_ * local_1298;
          fStack_370 = (float)uStack_920 * local_1298;
          fStack_36c = uStack_920._4_4_ * local_1298;
          local_388 = local_1cb8;
          uStack_380 = uStack_1cb0;
          fVar29 = local_378 + (float)local_10a8 * local_1278;
          fVar27 = fStack_374 + local_10a8._4_4_ * local_1278;
          fVar28 = fStack_370 + (float)uStack_10a0 * local_1278;
          fVar34 = fStack_36c + uStack_10a0._4_4_ * local_1278;
          local_a58 = CONCAT44(fVar27,fVar29);
          uStack_a50 = CONCAT44(fVar34,fVar28);
          local_978._0_4_ = (float)local_998;
          local_978._4_4_ = (float)((ulong)local_998 >> 0x20);
          uStack_970._0_4_ = (float)uStack_990;
          uStack_970._4_4_ = (float)((ulong)uStack_990 >> 0x20);
          local_358 = (float)local_978 * local_12b8;
          fStack_354 = local_978._4_4_ * local_12b8;
          fStack_350 = (float)uStack_970 * local_12b8;
          fStack_34c = uStack_970._4_4_ * local_12b8;
          fVar24 = local_358 + fVar24;
          fVar39 = fStack_354 + fVar39;
          fVar30 = fStack_350 + fVar30;
          fVar32 = fStack_34c + fVar32;
          local_aa8 = CONCAT44(fVar39,fVar24);
          uStack_aa0 = CONCAT44(fVar32,fVar30);
          local_9c8._0_4_ = (float)local_9e8;
          local_9c8._4_4_ = (float)((ulong)local_9e8 >> 0x20);
          uStack_9c0._0_4_ = (float)uStack_9e0;
          uStack_9c0._4_4_ = (float)((ulong)uStack_9e0 >> 0x20);
          local_338 = (float)local_9c8 * local_12b8;
          fStack_334 = local_9c8._4_4_ * local_12b8;
          fStack_330 = (float)uStack_9c0 * local_12b8;
          fStack_32c = uStack_9c0._4_4_ * local_12b8;
          fVar25 = local_338 + fVar25;
          fVar26 = fStack_334 + fVar26;
          fVar31 = fStack_330 + fVar31;
          fVar33 = fStack_32c + fVar33;
          local_af8 = CONCAT44(fVar26,fVar25);
          uStack_af0 = CONCAT44(fVar33,fVar31);
          local_a18._0_4_ = (float)local_a38;
          local_a18._4_4_ = (float)((ulong)local_a38 >> 0x20);
          uStack_a10._0_4_ = (float)uStack_a30;
          uStack_a10._4_4_ = (float)((ulong)uStack_a30 >> 0x20);
          local_318 = (float)local_a18 * local_12b8;
          fStack_314 = local_a18._4_4_ * local_12b8;
          fStack_310 = (float)uStack_a10 * local_12b8;
          fStack_30c = uStack_a10._4_4_ * local_12b8;
          fVar29 = local_318 + fVar29;
          fVar27 = fStack_314 + fVar27;
          fVar28 = fStack_310 + fVar28;
          fVar34 = fStack_30c + fVar34;
          local_b48 = CONCAT44(fVar27,fVar29);
          uStack_b40 = CONCAT44(fVar34,fVar28);
          local_a68._0_4_ = (float)local_a88;
          local_a68._4_4_ = (float)((ulong)local_a88 >> 0x20);
          uStack_a60._0_4_ = (float)uStack_a80;
          uStack_a60._4_4_ = (float)((ulong)uStack_a80 >> 0x20);
          local_2f8 = (float)local_a68 * local_12d8;
          fStack_2f4 = local_a68._4_4_ * local_12d8;
          fStack_2f0 = (float)uStack_a60 * local_12d8;
          fStack_2ec = uStack_a60._4_4_ * local_12d8;
          local_1458 = CONCAT44(fStack_2f4 + fVar39,local_2f8 + fVar24);
          uStack_1450 = CONCAT44(fStack_2ec + fVar32,fStack_2f0 + fVar30);
          local_ab8._0_4_ = (float)local_ad8;
          local_ab8._4_4_ = (float)((ulong)local_ad8 >> 0x20);
          uStack_ab0._0_4_ = (float)uStack_ad0;
          uStack_ab0._4_4_ = (float)((ulong)uStack_ad0 >> 0x20);
          local_2d8 = (float)local_ab8 * local_12d8;
          fStack_2d4 = local_ab8._4_4_ * local_12d8;
          fStack_2d0 = (float)uStack_ab0 * local_12d8;
          fStack_2cc = uStack_ab0._4_4_ * local_12d8;
          local_1478 = CONCAT44(fStack_2d4 + fVar26,local_2d8 + fVar25);
          uStack_1470 = CONCAT44(fStack_2cc + fVar33,fStack_2d0 + fVar31);
          local_b08._0_4_ = (float)local_b28;
          local_b08._4_4_ = (float)((ulong)local_b28 >> 0x20);
          uStack_b00._0_4_ = (float)uStack_b20;
          uStack_b00._4_4_ = (float)((ulong)uStack_b20 >> 0x20);
          local_2b8._0_4_ = (float)local_b08 * local_12d8;
          local_2b8._4_4_ = local_b08._4_4_ * local_12d8;
          local_2b8._8_4_ = (float)uStack_b00 * local_12d8;
          local_2b8._12_4_ = uStack_b00._4_4_ * local_12d8;
          local_1498 = CONCAT44(local_2b8._4_4_ + fVar27,local_2b8._0_4_ + fVar29);
          uStack_1490 = CONCAT44(local_2b8._12_4_ + fVar34,local_2b8._8_4_ + fVar28);
          local_1440 = (undefined8 *)((long)puVar20 + (long)(local_1b6c << 2) * 4);
          *local_1440 = local_1458;
          local_1440[1] = uStack_1450;
          local_1460 = (undefined8 *)((long)puVar19 + (long)(local_1b6c << 2) * 4);
          *local_1460 = local_1478;
          local_1460[1] = uStack_1470;
          local_1480 = (undefined8 *)((long)puVar18 + (long)(local_1b6c << 2) * 4);
          *local_1480 = local_1498;
          local_1480[1] = uStack_1490;
          local_1b50 = local_1b50 + 4;
          fStack_12d4 = local_12d8;
          fStack_12d0 = local_12d8;
          fStack_12cc = local_12d8;
          local_12bc = local_12d8;
          fStack_12b4 = local_12b8;
          fStack_12b0 = local_12b8;
          fStack_12ac = local_12b8;
          local_129c = local_12b8;
          fStack_1294 = local_1298;
          fStack_1290 = local_1298;
          fStack_128c = local_1298;
          local_127c = local_1298;
          fStack_1274 = local_1278;
          fStack_1270 = local_1278;
          fStack_126c = local_1278;
          local_125c = local_1278;
          local_10a8 = uVar14;
          uStack_10a0 = uVar15;
          local_1098 = local_10b8;
          uStack_1090 = uStack_10b0;
          local_1088 = uVar12;
          uStack_1080 = uVar13;
          local_1078 = local_10b8;
          uStack_1070 = uStack_10b0;
          local_1068 = uVar10;
          uStack_1060 = uVar11;
          local_b18 = local_b38;
          uStack_b10 = uStack_b30;
          local_b08 = local_b28;
          uStack_b00 = uStack_b20;
          local_ae8 = local_b38;
          uStack_ae0 = uStack_b30;
          local_ac8 = local_b38;
          uStack_ac0 = uStack_b30;
          local_ab8 = local_ad8;
          uStack_ab0 = uStack_ad0;
          local_a98 = local_b38;
          uStack_a90 = uStack_b30;
          local_a78 = local_b38;
          uStack_a70 = uStack_b30;
          local_a68 = local_a88;
          uStack_a60 = uStack_a80;
          local_a28 = local_a48;
          uStack_a20 = uStack_a40;
          local_a18 = local_a38;
          uStack_a10 = uStack_a30;
          local_9f8 = local_a48;
          uStack_9f0 = uStack_a40;
          local_9d8 = local_a48;
          uStack_9d0 = uStack_a40;
          local_9c8 = local_9e8;
          uStack_9c0 = uStack_9e0;
          local_9a8 = local_a48;
          uStack_9a0 = uStack_a40;
          local_988 = local_a48;
          uStack_980 = uStack_a40;
          local_978 = local_998;
          uStack_970 = uStack_990;
          local_938 = local_958;
          uStack_930 = uStack_950;
          local_928 = local_948;
          uStack_920 = uStack_940;
          local_908 = local_958;
          uStack_900 = uStack_950;
          local_8e8 = local_958;
          uStack_8e0 = uStack_950;
          local_8d8 = local_8f8;
          uStack_8d0 = uStack_8f0;
          local_8b8 = local_958;
          uStack_8b0 = uStack_950;
          local_898 = local_958;
          uStack_890 = uStack_950;
          local_888 = local_8a8;
          uStack_880 = uStack_8a0;
          local_368 = local_9b8;
          uStack_360 = uStack_9b0;
          local_348 = local_a08;
          uStack_340 = uStack_a00;
          local_328 = local_a58;
          uStack_320 = uStack_a50;
          local_308 = local_aa8;
          uStack_300 = uStack_aa0;
          local_2e8 = local_af8;
          uStack_2e0 = uStack_af0;
          local_2c8 = local_b48;
          uStack_2c0 = uStack_b40;
        }
      }
      else {
        local_15b4 = iVar41 + -1;
        local_15b0 = local_1790;
        lVar2 = *local_1790;
        iVar42 = *(int *)((long)local_1790 + 0x2c);
        lVar3 = local_1790[2];
        local_15c0 = local_1790;
        lVar4 = *local_1790;
        iVar1 = *(int *)((long)local_1790 + 0x2c);
        lVar5 = local_1790[2];
        local_15d4 = iVar41 + 1;
        local_15d0 = local_1790;
        lVar6 = *local_1790;
        iVar21 = *(int *)((long)local_1790 + 0x2c);
        lVar7 = local_1790[2];
        local_15e4 = iVar41 + 2;
        local_15e0 = local_1790;
        lVar8 = *local_1790;
        iVar22 = *(int *)((long)local_1790 + 0x2c);
        lVar9 = local_1790[2];
        local_1ce0 = local_17a0;
        for (local_1d04 = 0; local_15c4 = iVar41, local_1d04 < local_17bc;
            local_1d04 = local_1d04 + 1) {
          iVar23 = *(int *)(local_17a8 + (long)local_1d04 * 4) << 2;
          local_16b8 = (undefined8 *)
                       (lVar2 + (long)iVar42 * (long)local_15b4 * lVar3 + (long)iVar23 * 4);
          local_16d8 = (undefined8 *)(lVar4 + (long)iVar1 * (long)iVar41 * lVar5 + (long)iVar23 * 4)
          ;
          local_16f8 = (undefined8 *)
                       (lVar6 + (long)iVar21 * (long)local_15d4 * lVar7 + (long)iVar23 * 4);
          local_1718 = (undefined8 *)
                       (lVar8 + (long)iVar22 * (long)local_15e4 * lVar9 + (long)iVar23 * 4);
          local_12f8 = *local_1ce0;
          local_1138 = CONCAT44(local_12f8,local_12f8);
          uStack_1130 = CONCAT44(local_12f8,local_12f8);
          local_1318 = local_1ce0[1];
          local_c78 = CONCAT44(local_1318,local_1318);
          uStack_c70 = CONCAT44(local_1318,local_1318);
          local_1338 = local_1ce0[2];
          local_db8 = CONCAT44(local_1338,local_1338);
          uStack_db0 = CONCAT44(local_1338,local_1338);
          local_1358 = local_1ce0[3];
          local_ef8 = CONCAT44(local_1358,local_1358);
          uStack_ef0 = CONCAT44(local_1358,local_1358);
          local_16b0 = local_16b8 + -2;
          uVar10 = *local_16b0;
          uVar11 = local_16b8[-1];
          local_b78 = *local_16b8;
          uStack_b70 = local_16b8[1];
          local_16c0 = local_16b8 + 2;
          local_cb8 = *local_16c0;
          uStack_cb0 = local_16b8[3];
          local_16c8 = local_16b8 + 4;
          local_df8 = *local_16c8;
          uStack_df0 = local_16b8[5];
          local_16d0 = local_16d8 + -2;
          uVar12 = *local_16d0;
          uVar13 = local_16d8[-1];
          local_bc8 = *local_16d8;
          uStack_bc0 = local_16d8[1];
          local_16e0 = local_16d8 + 2;
          local_d08 = *local_16e0;
          uStack_d00 = local_16d8[3];
          local_16e8 = local_16d8 + 4;
          local_e48 = *local_16e8;
          uStack_e40 = local_16d8[5];
          local_16f0 = local_16f8 + -2;
          uVar14 = *local_16f0;
          uVar15 = local_16f8[-1];
          local_c18 = *local_16f8;
          uStack_c10 = local_16f8[1];
          local_1700 = local_16f8 + 2;
          local_d58 = *local_1700;
          uStack_d50 = local_16f8[3];
          local_1708 = local_16f8 + 4;
          local_e98 = *local_1708;
          uStack_e90 = local_16f8[5];
          local_1710 = local_1718 + -2;
          uVar16 = *local_1710;
          uVar17 = local_1718[-1];
          local_c68 = *local_1718;
          uStack_c60 = local_1718[1];
          local_1720 = local_1718 + 2;
          local_da8 = *local_1720;
          uStack_da0 = local_1718[3];
          local_1728 = local_1718 + 4;
          local_ee8 = *local_1728;
          uStack_ee0 = local_1718[5];
          local_10c8._0_4_ = (float)uVar10;
          local_10c8._4_4_ = (float)((ulong)uVar10 >> 0x20);
          uStack_10c0._0_4_ = (float)uVar11;
          uStack_10c0._4_4_ = (float)((ulong)uVar11 >> 0x20);
          local_1e78 = CONCAT44(local_10c8._4_4_ * local_12f8,(float)local_10c8 * local_12f8);
          uStack_1e70 = CONCAT44(uStack_10c0._4_4_ * local_12f8,(float)uStack_10c0 * local_12f8);
          local_10e8._0_4_ = (float)uVar12;
          local_10e8._4_4_ = (float)((ulong)uVar12 >> 0x20);
          uStack_10e0._0_4_ = (float)uVar13;
          uStack_10e0._4_4_ = (float)((ulong)uVar13 >> 0x20);
          local_1e88 = CONCAT44(local_10e8._4_4_ * local_12f8,(float)local_10e8 * local_12f8);
          uStack_1e80 = CONCAT44(uStack_10e0._4_4_ * local_12f8,(float)uStack_10e0 * local_12f8);
          local_1108._0_4_ = (float)uVar14;
          local_1108._4_4_ = (float)((ulong)uVar14 >> 0x20);
          uStack_1100._0_4_ = (float)uVar15;
          uStack_1100._4_4_ = (float)((ulong)uVar15 >> 0x20);
          local_1e98 = CONCAT44(local_1108._4_4_ * local_12f8,(float)local_1108 * local_12f8);
          uStack_1e90 = CONCAT44(uStack_1100._4_4_ * local_12f8,(float)uStack_1100 * local_12f8);
          local_1128._0_4_ = (float)uVar16;
          local_1128._4_4_ = (float)((ulong)uVar16 >> 0x20);
          uStack_1120._0_4_ = (float)uVar17;
          uStack_1120._4_4_ = (float)((ulong)uVar17 >> 0x20);
          local_1ea8 = CONCAT44(local_1128._4_4_ * local_12f8,(float)local_1128 * local_12f8);
          uStack_1ea0 = CONCAT44(uStack_1120._4_4_ * local_12f8,(float)uStack_1120 * local_12f8);
          local_b98 = local_1e78;
          uStack_b90 = uStack_1e70;
          local_b58._0_4_ = (float)local_b78;
          local_b58._4_4_ = (float)((ulong)local_b78 >> 0x20);
          uStack_b50._0_4_ = (float)uStack_b70;
          uStack_b50._4_4_ = (float)((ulong)uStack_b70 >> 0x20);
          local_298 = (float)local_b58 * local_1318;
          fStack_294 = local_b58._4_4_ * local_1318;
          fStack_290 = (float)uStack_b50 * local_1318;
          fStack_28c = uStack_b50._4_4_ * local_1318;
          local_2a8 = local_1e78;
          uStack_2a0 = uStack_1e70;
          fVar24 = local_298 + (float)local_10c8 * local_12f8;
          fVar26 = fStack_294 + local_10c8._4_4_ * local_12f8;
          fVar28 = fStack_290 + (float)uStack_10c0 * local_12f8;
          fVar35 = fStack_28c + uStack_10c0._4_4_ * local_12f8;
          local_cd8 = CONCAT44(fVar26,fVar24);
          uStack_cd0 = CONCAT44(fVar35,fVar28);
          local_be8 = local_1e88;
          uStack_be0 = uStack_1e80;
          local_ba8._0_4_ = (float)local_bc8;
          local_ba8._4_4_ = (float)((ulong)local_bc8 >> 0x20);
          uStack_ba0._0_4_ = (float)uStack_bc0;
          uStack_ba0._4_4_ = (float)((ulong)uStack_bc0 >> 0x20);
          local_278 = (float)local_ba8 * local_1318;
          fStack_274 = local_ba8._4_4_ * local_1318;
          fStack_270 = (float)uStack_ba0 * local_1318;
          fStack_26c = uStack_ba0._4_4_ * local_1318;
          local_288 = local_1e88;
          uStack_280 = uStack_1e80;
          fVar25 = local_278 + (float)local_10e8 * local_12f8;
          fVar27 = fStack_274 + local_10e8._4_4_ * local_12f8;
          fVar32 = fStack_270 + (float)uStack_10e0 * local_12f8;
          fVar36 = fStack_26c + uStack_10e0._4_4_ * local_12f8;
          local_d28 = CONCAT44(fVar27,fVar25);
          uStack_d20 = CONCAT44(fVar36,fVar32);
          local_c38 = local_1e98;
          uStack_c30 = uStack_1e90;
          local_bf8._0_4_ = (float)local_c18;
          local_bf8._4_4_ = (float)((ulong)local_c18 >> 0x20);
          uStack_bf0._0_4_ = (float)uStack_c10;
          uStack_bf0._4_4_ = (float)((ulong)uStack_c10 >> 0x20);
          local_258 = (float)local_bf8 * local_1318;
          fStack_254 = local_bf8._4_4_ * local_1318;
          fStack_250 = (float)uStack_bf0 * local_1318;
          fStack_24c = uStack_bf0._4_4_ * local_1318;
          local_268 = local_1e98;
          uStack_260 = uStack_1e90;
          fVar29 = local_258 + (float)local_1108 * local_12f8;
          fVar30 = fStack_254 + local_1108._4_4_ * local_12f8;
          fVar33 = fStack_250 + (float)uStack_1100 * local_12f8;
          fVar37 = fStack_24c + uStack_1100._4_4_ * local_12f8;
          local_d78 = CONCAT44(fVar30,fVar29);
          uStack_d70 = CONCAT44(fVar37,fVar33);
          local_c88 = local_1ea8;
          uStack_c80 = uStack_1ea0;
          local_c48._0_4_ = (float)local_c68;
          local_c48._4_4_ = (float)((ulong)local_c68 >> 0x20);
          uStack_c40._0_4_ = (float)uStack_c60;
          uStack_c40._4_4_ = (float)((ulong)uStack_c60 >> 0x20);
          local_238 = (float)local_c48 * local_1318;
          fStack_234 = local_c48._4_4_ * local_1318;
          fStack_230 = (float)uStack_c40 * local_1318;
          fStack_22c = uStack_c40._4_4_ * local_1318;
          local_248 = local_1ea8;
          uStack_240 = uStack_1ea0;
          fVar39 = local_238 + (float)local_1128 * local_12f8;
          fVar31 = fStack_234 + local_1128._4_4_ * local_12f8;
          fVar34 = fStack_230 + (float)uStack_1120 * local_12f8;
          fVar38 = fStack_22c + uStack_1120._4_4_ * local_12f8;
          local_dc8 = CONCAT44(fVar31,fVar39);
          uStack_dc0 = CONCAT44(fVar38,fVar34);
          local_c98._0_4_ = (float)local_cb8;
          local_c98._4_4_ = (float)((ulong)local_cb8 >> 0x20);
          uStack_c90._0_4_ = (float)uStack_cb0;
          uStack_c90._4_4_ = (float)((ulong)uStack_cb0 >> 0x20);
          local_218 = (float)local_c98 * local_1338;
          fStack_214 = local_c98._4_4_ * local_1338;
          fStack_210 = (float)uStack_c90 * local_1338;
          fStack_20c = uStack_c90._4_4_ * local_1338;
          fVar24 = local_218 + fVar24;
          fVar26 = fStack_214 + fVar26;
          fVar28 = fStack_210 + fVar28;
          fVar35 = fStack_20c + fVar35;
          local_e18 = CONCAT44(fVar26,fVar24);
          uStack_e10 = CONCAT44(fVar35,fVar28);
          local_ce8._0_4_ = (float)local_d08;
          local_ce8._4_4_ = (float)((ulong)local_d08 >> 0x20);
          uStack_ce0._0_4_ = (float)uStack_d00;
          uStack_ce0._4_4_ = (float)((ulong)uStack_d00 >> 0x20);
          local_1f8 = (float)local_ce8 * local_1338;
          fStack_1f4 = local_ce8._4_4_ * local_1338;
          fStack_1f0 = (float)uStack_ce0 * local_1338;
          fStack_1ec = uStack_ce0._4_4_ * local_1338;
          fVar25 = local_1f8 + fVar25;
          fVar27 = fStack_1f4 + fVar27;
          fVar32 = fStack_1f0 + fVar32;
          fVar36 = fStack_1ec + fVar36;
          local_e68 = CONCAT44(fVar27,fVar25);
          uStack_e60 = CONCAT44(fVar36,fVar32);
          local_d38._0_4_ = (float)local_d58;
          local_d38._4_4_ = (float)((ulong)local_d58 >> 0x20);
          uStack_d30._0_4_ = (float)uStack_d50;
          uStack_d30._4_4_ = (float)((ulong)uStack_d50 >> 0x20);
          local_1d8 = (float)local_d38 * local_1338;
          fStack_1d4 = local_d38._4_4_ * local_1338;
          fStack_1d0 = (float)uStack_d30 * local_1338;
          fStack_1cc = uStack_d30._4_4_ * local_1338;
          fVar29 = local_1d8 + fVar29;
          fVar30 = fStack_1d4 + fVar30;
          fVar33 = fStack_1d0 + fVar33;
          fVar37 = fStack_1cc + fVar37;
          local_eb8 = CONCAT44(fVar30,fVar29);
          uStack_eb0 = CONCAT44(fVar37,fVar33);
          local_d88._0_4_ = (float)local_da8;
          local_d88._4_4_ = (float)((ulong)local_da8 >> 0x20);
          uStack_d80._0_4_ = (float)uStack_da0;
          uStack_d80._4_4_ = (float)((ulong)uStack_da0 >> 0x20);
          local_1b8 = (float)local_d88 * local_1338;
          fStack_1b4 = local_d88._4_4_ * local_1338;
          fStack_1b0 = (float)uStack_d80 * local_1338;
          fStack_1ac = uStack_d80._4_4_ * local_1338;
          fVar39 = local_1b8 + fVar39;
          fVar31 = fStack_1b4 + fVar31;
          fVar34 = fStack_1b0 + fVar34;
          fVar38 = fStack_1ac + fVar38;
          local_f08 = CONCAT44(fVar31,fVar39);
          uStack_f00 = CONCAT44(fVar38,fVar34);
          local_dd8._0_4_ = (float)local_df8;
          local_dd8._4_4_ = (float)((ulong)local_df8 >> 0x20);
          uStack_dd0._0_4_ = (float)uStack_df0;
          uStack_dd0._4_4_ = (float)((ulong)uStack_df0 >> 0x20);
          local_198 = (float)local_dd8 * local_1358;
          fStack_194 = local_dd8._4_4_ * local_1358;
          fStack_190 = (float)uStack_dd0 * local_1358;
          fStack_18c = uStack_dd0._4_4_ * local_1358;
          local_14b8 = CONCAT44(fStack_194 + fVar26,local_198 + fVar24);
          uStack_14b0 = CONCAT44(fStack_18c + fVar35,fStack_190 + fVar28);
          local_e28._0_4_ = (float)local_e48;
          local_e28._4_4_ = (float)((ulong)local_e48 >> 0x20);
          uStack_e20._0_4_ = (float)uStack_e40;
          uStack_e20._4_4_ = (float)((ulong)uStack_e40 >> 0x20);
          local_178 = (float)local_e28 * local_1358;
          fStack_174 = local_e28._4_4_ * local_1358;
          fStack_170 = (float)uStack_e20 * local_1358;
          fStack_16c = uStack_e20._4_4_ * local_1358;
          local_14d8 = CONCAT44(fStack_174 + fVar27,local_178 + fVar25);
          uStack_14d0 = CONCAT44(fStack_16c + fVar36,fStack_170 + fVar32);
          local_e78._0_4_ = (float)local_e98;
          local_e78._4_4_ = (float)((ulong)local_e98 >> 0x20);
          uStack_e70._0_4_ = (float)uStack_e90;
          uStack_e70._4_4_ = (float)((ulong)uStack_e90 >> 0x20);
          local_158 = (float)local_e78 * local_1358;
          fStack_154 = local_e78._4_4_ * local_1358;
          fStack_150 = (float)uStack_e70 * local_1358;
          fStack_14c = uStack_e70._4_4_ * local_1358;
          local_14f8 = CONCAT44(fStack_154 + fVar30,local_158 + fVar29);
          uStack_14f0 = CONCAT44(fStack_14c + fVar37,fStack_150 + fVar33);
          local_ec8._0_4_ = (float)local_ee8;
          local_ec8._4_4_ = (float)((ulong)local_ee8 >> 0x20);
          uStack_ec0._0_4_ = (float)uStack_ee0;
          uStack_ec0._4_4_ = (float)((ulong)uStack_ee0 >> 0x20);
          local_138._0_4_ = (float)local_ec8 * local_1358;
          local_138._4_4_ = local_ec8._4_4_ * local_1358;
          local_138._8_4_ = (float)uStack_ec0 * local_1358;
          local_138._12_4_ = uStack_ec0._4_4_ * local_1358;
          local_1518 = CONCAT44(local_138._4_4_ + fVar31,local_138._0_4_ + fVar39);
          uStack_1510 = CONCAT44(local_138._12_4_ + fVar38,local_138._8_4_ + fVar34);
          local_14a0 = (undefined8 *)((long)local_18f8 + (long)(local_1d04 << 2) * 4);
          *local_14a0 = local_14b8;
          local_14a0[1] = uStack_14b0;
          local_14c0 = (undefined8 *)((long)local_1900 + (long)(local_1d04 << 2) * 4);
          *local_14c0 = local_14d8;
          local_14c0[1] = uStack_14d0;
          local_14e0 = (undefined8 *)((long)local_1908 + (long)(local_1d04 << 2) * 4);
          *local_14e0 = local_14f8;
          local_14e0[1] = uStack_14f0;
          local_1500 = (undefined8 *)((long)local_1910 + (long)(local_1d04 << 2) * 4);
          *local_1500 = local_1518;
          local_1500[1] = uStack_1510;
          local_1ce0 = local_1ce0 + 4;
          fStack_1354 = local_1358;
          fStack_1350 = local_1358;
          fStack_134c = local_1358;
          local_133c = local_1358;
          fStack_1334 = local_1338;
          fStack_1330 = local_1338;
          fStack_132c = local_1338;
          local_131c = local_1338;
          fStack_1314 = local_1318;
          fStack_1310 = local_1318;
          fStack_130c = local_1318;
          local_12fc = local_1318;
          fStack_12f4 = local_12f8;
          fStack_12f0 = local_12f8;
          fStack_12ec = local_12f8;
          local_12dc = local_12f8;
          local_1128 = uVar16;
          uStack_1120 = uVar17;
          local_1118 = local_1138;
          uStack_1110 = uStack_1130;
          local_1108 = uVar14;
          uStack_1100 = uVar15;
          local_10f8 = local_1138;
          uStack_10f0 = uStack_1130;
          local_10e8 = uVar12;
          uStack_10e0 = uVar13;
          local_10d8 = local_1138;
          uStack_10d0 = uStack_1130;
          local_10c8 = uVar10;
          uStack_10c0 = uVar11;
          local_ed8 = local_ef8;
          uStack_ed0 = uStack_ef0;
          local_ec8 = local_ee8;
          uStack_ec0 = uStack_ee0;
          local_ea8 = local_ef8;
          uStack_ea0 = uStack_ef0;
          local_e88 = local_ef8;
          uStack_e80 = uStack_ef0;
          local_e78 = local_e98;
          uStack_e70 = uStack_e90;
          local_e58 = local_ef8;
          uStack_e50 = uStack_ef0;
          local_e38 = local_ef8;
          uStack_e30 = uStack_ef0;
          local_e28 = local_e48;
          uStack_e20 = uStack_e40;
          local_e08 = local_ef8;
          uStack_e00 = uStack_ef0;
          local_de8 = local_ef8;
          uStack_de0 = uStack_ef0;
          local_dd8 = local_df8;
          uStack_dd0 = uStack_df0;
          local_d98 = local_db8;
          uStack_d90 = uStack_db0;
          local_d88 = local_da8;
          uStack_d80 = uStack_da0;
          local_d68 = local_db8;
          uStack_d60 = uStack_db0;
          local_d48 = local_db8;
          uStack_d40 = uStack_db0;
          local_d38 = local_d58;
          uStack_d30 = uStack_d50;
          local_d18 = local_db8;
          uStack_d10 = uStack_db0;
          local_cf8 = local_db8;
          uStack_cf0 = uStack_db0;
          local_ce8 = local_d08;
          uStack_ce0 = uStack_d00;
          local_cc8 = local_db8;
          uStack_cc0 = uStack_db0;
          local_ca8 = local_db8;
          uStack_ca0 = uStack_db0;
          local_c98 = local_cb8;
          uStack_c90 = uStack_cb0;
          local_c58 = local_c78;
          uStack_c50 = uStack_c70;
          local_c48 = local_c68;
          uStack_c40 = uStack_c60;
          local_c28 = local_c78;
          uStack_c20 = uStack_c70;
          local_c08 = local_c78;
          uStack_c00 = uStack_c70;
          local_bf8 = local_c18;
          uStack_bf0 = uStack_c10;
          local_bd8 = local_c78;
          uStack_bd0 = uStack_c70;
          local_bb8 = local_c78;
          uStack_bb0 = uStack_c70;
          local_ba8 = local_bc8;
          uStack_ba0 = uStack_bc0;
          local_b88 = local_c78;
          uStack_b80 = uStack_c70;
          local_b68 = local_c78;
          uStack_b60 = uStack_c70;
          local_b58 = local_b78;
          uStack_b50 = uStack_b70;
          local_228 = local_cd8;
          uStack_220 = uStack_cd0;
          local_208 = local_d28;
          uStack_200 = uStack_d20;
          local_1e8 = local_d78;
          uStack_1e0 = uStack_d70;
          local_1c8 = local_dc8;
          uStack_1c0 = uStack_dc0;
          local_1a8 = local_e18;
          uStack_1a0 = uStack_e10;
          local_188 = local_e68;
          uStack_180 = uStack_e60;
          local_168 = local_eb8;
          uStack_160 = uStack_eb0;
          local_148 = local_f08;
          uStack_140 = uStack_f00;
        }
      }
    }
    local_1378 = *local_17b0;
    local_1398 = local_17b0[1];
    local_13b8 = local_17b0[2];
    local_13d8 = local_17b0[3];
    local_1ef0 = local_18f8;
    local_1ef8 = local_1900;
    local_1f00 = local_1908;
    local_1f08 = local_1910;
    local_1540 = local_1798;
    local_1544 = local_1918;
    local_1f10 = (undefined8 *)
                 (*local_1798 +
                 (long)*(int *)((long)local_1798 + 0x2c) * (long)local_1918 * local_1798[2]);
    for (local_1f14 = 0; local_1f14 < local_17bc; local_1f14 = local_1f14 + 1) {
      local_1730 = local_1ef0;
      uVar10 = *local_1ef0;
      uVar11 = local_1ef0[1];
      local_1738 = local_1ef8;
      local_f38 = *local_1ef8;
      uStack_f30 = local_1ef8[1];
      local_1740 = local_1f00;
      local_f88 = *local_1f00;
      uStack_f80 = local_1f00[1];
      local_1748 = local_1f08;
      local_fd8 = *local_1f08;
      uStack_fd0 = local_1f08[1];
      local_1148._0_4_ = (float)uVar10;
      local_1148._4_4_ = (float)((ulong)uVar10 >> 0x20);
      uStack_1140._0_4_ = (float)uVar11;
      uStack_1140._4_4_ = (float)((ulong)uVar11 >> 0x20);
      local_1f68 = CONCAT44(local_1148._4_4_ * local_1378,(float)local_1148 * local_1378);
      uStack_1f60 = CONCAT44(uStack_1140._4_4_ * local_1378,(float)uStack_1140 * local_1378);
      local_f58 = local_1f68;
      uStack_f50 = uStack_1f60;
      local_f18._0_4_ = (float)local_f38;
      local_f18._4_4_ = (float)((ulong)local_f38 >> 0x20);
      uStack_f10._0_4_ = (float)uStack_f30;
      uStack_f10._4_4_ = (float)((ulong)uStack_f30 >> 0x20);
      local_118 = (float)local_f18 * local_1398;
      fStack_114 = local_f18._4_4_ * local_1398;
      fStack_110 = (float)uStack_f10 * local_1398;
      fStack_10c = uStack_f10._4_4_ * local_1398;
      local_128 = local_1f68;
      uStack_120 = uStack_1f60;
      fVar24 = local_118 + (float)local_1148 * local_1378;
      fVar25 = fStack_114 + local_1148._4_4_ * local_1378;
      fVar29 = fStack_110 + (float)uStack_1140 * local_1378;
      fVar39 = fStack_10c + uStack_1140._4_4_ * local_1378;
      local_fa8 = CONCAT44(fVar25,fVar24);
      uStack_fa0 = CONCAT44(fVar39,fVar29);
      local_f68._0_4_ = (float)local_f88;
      local_f68._4_4_ = (float)((ulong)local_f88 >> 0x20);
      uStack_f60._0_4_ = (float)uStack_f80;
      uStack_f60._4_4_ = (float)((ulong)uStack_f80 >> 0x20);
      local_f8 = (float)local_f68 * local_13b8;
      fStack_f4 = local_f68._4_4_ * local_13b8;
      fStack_f0 = (float)uStack_f60 * local_13b8;
      fStack_ec = uStack_f60._4_4_ * local_13b8;
      fVar24 = local_f8 + fVar24;
      fVar25 = fStack_f4 + fVar25;
      fVar29 = fStack_f0 + fVar29;
      fVar39 = fStack_ec + fVar39;
      local_ff8 = CONCAT44(fVar25,fVar24);
      uStack_ff0 = CONCAT44(fVar39,fVar29);
      local_fb8._0_4_ = (float)local_fd8;
      local_fb8._4_4_ = (float)((ulong)local_fd8 >> 0x20);
      uStack_fb0._0_4_ = (float)uStack_fd0;
      uStack_fb0._4_4_ = (float)((ulong)uStack_fd0 >> 0x20);
      local_d8._0_4_ = (float)local_fb8 * local_13d8;
      local_d8._4_4_ = local_fb8._4_4_ * local_13d8;
      local_d8._8_4_ = (float)uStack_fb0 * local_13d8;
      local_d8._12_4_ = uStack_fb0._4_4_ * local_13d8;
      local_1538 = CONCAT44(local_d8._4_4_ + fVar25,local_d8._0_4_ + fVar24);
      uStack_1530 = CONCAT44(local_d8._12_4_ + fVar39,local_d8._8_4_ + fVar29);
      local_1520 = local_1f10;
      *local_1f10 = local_1538;
      local_1f10[1] = uStack_1530;
      local_1f10 = local_1f10 + 2;
      local_1ef0 = local_1ef0 + 2;
      local_1ef8 = local_1ef8 + 2;
      local_1f00 = local_1f00 + 2;
      local_1f08 = local_1f08 + 2;
      local_1158 = CONCAT44(local_1378,local_1378);
      uStack_1150 = CONCAT44(local_1378,local_1378);
      local_1148 = uVar10;
      uStack_1140 = uVar11;
      local_fe8 = CONCAT44(local_13d8,local_13d8);
      uStack_fe0 = CONCAT44(local_13d8,local_13d8);
      local_fc8 = CONCAT44(local_13d8,local_13d8);
      uStack_fc0 = CONCAT44(local_13d8,local_13d8);
      local_fb8 = local_fd8;
      uStack_fb0 = uStack_fd0;
      local_f98 = CONCAT44(local_13b8,local_13b8);
      uStack_f90 = CONCAT44(local_13b8,local_13b8);
      local_f78 = CONCAT44(local_13b8,local_13b8);
      uStack_f70 = CONCAT44(local_13b8,local_13b8);
      local_f68 = local_f88;
      uStack_f60 = uStack_f80;
      local_f48 = CONCAT44(local_1398,local_1398);
      uStack_f40 = CONCAT44(local_1398,local_1398);
      local_f28 = CONCAT44(local_1398,local_1398);
      uStack_f20 = CONCAT44(local_1398,local_1398);
      local_f18 = local_f38;
      uStack_f10 = uStack_f30;
      local_108 = local_fa8;
      uStack_100 = uStack_fa0;
      local_e8 = local_ff8;
      uStack_e0 = uStack_ff0;
    }
    local_17b0 = local_17b0 + 4;
    local_1914 = iVar41;
    fStack_13d4 = local_13d8;
    fStack_13d0 = local_13d8;
    fStack_13cc = local_13d8;
    local_13bc = local_13d8;
    fStack_13b4 = local_13b8;
    fStack_13b0 = local_13b8;
    fStack_13ac = local_13b8;
    local_139c = local_13b8;
    fStack_1394 = local_1398;
    fStack_1390 = local_1398;
    fStack_138c = local_1398;
    local_137c = local_1398;
    fStack_1374 = local_1378;
    fStack_1370 = local_1378;
    fStack_136c = local_1378;
    local_135c = local_1378;
  }
  ppuVar40 = &local_18f0;
  local_1788 = ppuVar40;
  local_530 = ppuVar40;
  if (local_18e8 != (int *)0x0) {
    local_534 = 0xffffffff;
    LOCK();
    local_538 = *local_18e8;
    *local_18e8 = *local_18e8 + -1;
    UNLOCK();
    if (local_538 == 1) {
      if (local_18d0 == (long *)0x0) {
        local_528 = local_18f0;
        if (local_18f0 != (undefined8 *)0x0) {
          free(local_18f0);
        }
      }
      else {
        (**(code **)(*local_18d0 + 0x18))(local_18d0,local_18f0);
      }
    }
  }
  *ppuVar40 = (undefined8 *)0x0;
  ppuVar40[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar40 + 3) = 0;
  *(undefined4 *)(ppuVar40 + 5) = 0;
  *(undefined4 *)((long)ppuVar40 + 0x2c) = 0;
  *(undefined4 *)(ppuVar40 + 6) = 0;
  *(undefined4 *)((long)ppuVar40 + 0x34) = 0;
  *(undefined4 *)(ppuVar40 + 7) = 0;
  ppuVar40[8] = (undefined8 *)0x0;
  ppuVar40[1] = (undefined8 *)0x0;
  ppuVar40 = &local_18a8;
  local_1778 = ppuVar40;
  local_550 = ppuVar40;
  if (local_18a0 != (int *)0x0) {
    local_554 = 0xffffffff;
    LOCK();
    local_558 = *local_18a0;
    *local_18a0 = *local_18a0 + -1;
    UNLOCK();
    if (local_558 == 1) {
      if (local_1888 == (long *)0x0) {
        local_518 = local_18a8;
        if (local_18a8 != (undefined8 *)0x0) {
          free(local_18a8);
        }
      }
      else {
        (**(code **)(*local_1888 + 0x18))(local_1888,local_18a8);
      }
    }
  }
  *ppuVar40 = (undefined8 *)0x0;
  ppuVar40[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar40 + 3) = 0;
  *(undefined4 *)(ppuVar40 + 5) = 0;
  *(undefined4 *)((long)ppuVar40 + 0x2c) = 0;
  *(undefined4 *)(ppuVar40 + 6) = 0;
  *(undefined4 *)((long)ppuVar40 + 0x34) = 0;
  *(undefined4 *)(ppuVar40 + 7) = 0;
  ppuVar40[8] = (undefined8 *)0x0;
  ppuVar40[1] = (undefined8 *)0x0;
  ppuVar40 = &local_1850;
  local_1768 = ppuVar40;
  local_570 = ppuVar40;
  if (local_1848 != (int *)0x0) {
    local_574 = 0xffffffff;
    LOCK();
    local_578 = *local_1848;
    *local_1848 = *local_1848 + -1;
    UNLOCK();
    if (local_578 == 1) {
      if (local_1830 == (long *)0x0) {
        local_508 = local_1850;
        if (local_1850 != (undefined8 *)0x0) {
          free(local_1850);
        }
      }
      else {
        (**(code **)(*local_1830 + 0x18))(local_1830,local_1850);
      }
    }
  }
  *ppuVar40 = (undefined8 *)0x0;
  ppuVar40[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar40 + 3) = 0;
  *(undefined4 *)(ppuVar40 + 5) = 0;
  *(undefined4 *)((long)ppuVar40 + 0x2c) = 0;
  *(undefined4 *)(ppuVar40 + 6) = 0;
  *(undefined4 *)((long)ppuVar40 + 0x34) = 0;
  *(undefined4 *)(ppuVar40 + 7) = 0;
  ppuVar40[8] = (undefined8 *)0x0;
  ppuVar40[1] = (undefined8 *)0x0;
  ppuVar40 = &local_1808;
  if (local_1800 != (int *)0x0) {
    local_594 = 0xffffffff;
    LOCK();
    local_598 = *local_1800;
    *local_1800 = *local_1800 + -1;
    UNLOCK();
    if (local_598 == 1) {
      local_1758 = ppuVar40;
      local_590 = ppuVar40;
      if (local_17e8 == (long *)0x0) {
        local_4f8 = local_1808;
        if (local_1808 != (undefined8 *)0x0) {
          free(local_1808);
        }
      }
      else {
        (**(code **)(*local_17e8 + 0x18))(local_17e8,local_1808);
      }
    }
  }
  *ppuVar40 = (undefined8 *)0x0;
  ppuVar40[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar40 + 3) = 0;
  *(undefined4 *)(ppuVar40 + 5) = 0;
  *(undefined4 *)((long)ppuVar40 + 0x2c) = 0;
  *(undefined4 *)(ppuVar40 + 6) = 0;
  *(undefined4 *)((long)ppuVar40 + 0x34) = 0;
  *(undefined4 *)(ppuVar40 + 7) = 0;
  ppuVar40[8] = (undefined8 *)0x0;
  ppuVar40[1] = (undefined8 *)0x0;
  return;
}

Assistant:

static void resize_bicubic_image_pack4(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w, (size_t)4 * 4u, 4);
    Mat rowsbuf1(w, (size_t)4 * 4u, 4);
    Mat rowsbuf2(w, (size_t)4 * 4u, 4);
    Mat rowsbuf3(w, (size_t)4 * 4u, 4);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;
    float* rows2 = rowsbuf2;
    float* rows3 = rowsbuf3;

    int prev_sy1 = -3;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows2;
            rows2 = rows3;
            rows3 = rows0_old;
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S3p = S3 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);
                __m128 _a2 = _mm_set1_ps(alphap[2]);
                __m128 _a3 = _mm_set1_ps(alphap[3]);

                __m128 _S30 = _mm_load_ps(S3p - 4);
                __m128 _S31 = _mm_load_ps(S3p + 0);
                __m128 _S32 = _mm_load_ps(S3p + 4);
                __m128 _S33 = _mm_load_ps(S3p + 8);
                __m128 _rows3 = _mm_mul_ps(_S30, _a0);
                _rows3 = _mm_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows3 = _mm_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows3 = _mm_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm_store_ps(rows3p + dx * 4, _rows3);

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 2)
        {
            // hresize two rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            rows0 = rows2;
            rows1 = rows3;
            rows2 = rows0_old;
            rows3 = rows1_old;
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);
                __m128 _a2 = _mm_set1_ps(alphap[2]);
                __m128 _a3 = _mm_set1_ps(alphap[3]);

                __m128 _S20 = _mm_load_ps(S2p - 4);
                __m128 _S21 = _mm_load_ps(S2p + 0);
                __m128 _S22 = _mm_load_ps(S2p + 4);
                __m128 _S23 = _mm_load_ps(S2p + 8);
                __m128 _S30 = _mm_load_ps(S3p - 4);
                __m128 _S31 = _mm_load_ps(S3p + 0);
                __m128 _S32 = _mm_load_ps(S3p + 4);
                __m128 _S33 = _mm_load_ps(S3p + 8);
                __m128 _rows2 = _mm_mul_ps(_S20, _a0);
                __m128 _rows3 = _mm_mul_ps(_S30, _a0);
                _rows2 = _mm_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows2 = _mm_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows2 = _mm_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm_store_ps(rows2p + dx * 4, _rows2);
                _mm_store_ps(rows3p + dx * 4, _rows3);

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 3)
        {
            // hresize three rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            float* rows2_old = rows2;
            rows0 = rows3;
            rows1 = rows0_old;
            rows2 = rows1_old;
            rows3 = rows2_old;
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);
                __m128 _a2 = _mm_set1_ps(alphap[2]);
                __m128 _a3 = _mm_set1_ps(alphap[3]);

                __m128 _S10 = _mm_load_ps(S1p - 4);
                __m128 _S11 = _mm_load_ps(S1p + 0);
                __m128 _S12 = _mm_load_ps(S1p + 4);
                __m128 _S13 = _mm_load_ps(S1p + 8);
                __m128 _S20 = _mm_load_ps(S2p - 4);
                __m128 _S21 = _mm_load_ps(S2p + 0);
                __m128 _S22 = _mm_load_ps(S2p + 4);
                __m128 _S23 = _mm_load_ps(S2p + 8);
                __m128 _S30 = _mm_load_ps(S3p - 4);
                __m128 _S31 = _mm_load_ps(S3p + 0);
                __m128 _S32 = _mm_load_ps(S3p + 4);
                __m128 _S33 = _mm_load_ps(S3p + 8);
                __m128 _rows1 = _mm_mul_ps(_S10, _a0);
                __m128 _rows2 = _mm_mul_ps(_S20, _a0);
                __m128 _rows3 = _mm_mul_ps(_S30, _a0);
                _rows1 = _mm_comp_fmadd_ps(_S11, _a1, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows1 = _mm_comp_fmadd_ps(_S12, _a2, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows1 = _mm_comp_fmadd_ps(_S13, _a3, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm_store_ps(rows1p + dx * 4, _rows1);
                _mm_store_ps(rows2p + dx * 4, _rows2);
                _mm_store_ps(rows3p + dx * 4, _rows3);

                alphap += 4;
            }
        }
        else
        {
            // hresize four rows
            const float* S0 = src.row(sy - 1);
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);
                __m128 _a2 = _mm_set1_ps(alphap[2]);
                __m128 _a3 = _mm_set1_ps(alphap[3]);

                __m128 _S00 = _mm_load_ps(S0p - 4);
                __m128 _S01 = _mm_load_ps(S0p + 0);
                __m128 _S02 = _mm_load_ps(S0p + 4);
                __m128 _S03 = _mm_load_ps(S0p + 8);
                __m128 _S10 = _mm_load_ps(S1p - 4);
                __m128 _S11 = _mm_load_ps(S1p + 0);
                __m128 _S12 = _mm_load_ps(S1p + 4);
                __m128 _S13 = _mm_load_ps(S1p + 8);
                __m128 _S20 = _mm_load_ps(S2p - 4);
                __m128 _S21 = _mm_load_ps(S2p + 0);
                __m128 _S22 = _mm_load_ps(S2p + 4);
                __m128 _S23 = _mm_load_ps(S2p + 8);
                __m128 _S30 = _mm_load_ps(S3p - 4);
                __m128 _S31 = _mm_load_ps(S3p + 0);
                __m128 _S32 = _mm_load_ps(S3p + 4);
                __m128 _S33 = _mm_load_ps(S3p + 8);
                __m128 _rows0 = _mm_mul_ps(_S00, _a0);
                __m128 _rows1 = _mm_mul_ps(_S10, _a0);
                __m128 _rows2 = _mm_mul_ps(_S20, _a0);
                __m128 _rows3 = _mm_mul_ps(_S30, _a0);
                _rows0 = _mm_comp_fmadd_ps(_S01, _a1, _rows0);
                _rows1 = _mm_comp_fmadd_ps(_S11, _a1, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows0 = _mm_comp_fmadd_ps(_S02, _a2, _rows0);
                _rows1 = _mm_comp_fmadd_ps(_S12, _a2, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows0 = _mm_comp_fmadd_ps(_S03, _a3, _rows0);
                _rows1 = _mm_comp_fmadd_ps(_S13, _a3, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm_store_ps(rows0p + dx * 4, _rows0);
                _mm_store_ps(rows1p + dx * 4, _rows1);
                _mm_store_ps(rows2p + dx * 4, _rows2);
                _mm_store_ps(rows3p + dx * 4, _rows3);

                alphap += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        __m128 _b0 = _mm_set1_ps(beta[0]);
        __m128 _b1 = _mm_set1_ps(beta[1]);
        __m128 _b2 = _mm_set1_ps(beta[2]);
        __m128 _b3 = _mm_set1_ps(beta[3]);

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* rows2p = rows2;
        float* rows3p = rows3;
        float* Dp = dst.row(dy);

        for (int dx = 0; dx < w; dx++)
        {
            __m128 _rows0 = _mm_load_ps(rows0p);
            __m128 _rows1 = _mm_load_ps(rows1p);
            __m128 _rows2 = _mm_load_ps(rows2p);
            __m128 _rows3 = _mm_load_ps(rows3p);
            __m128 _D = _mm_mul_ps(_rows0, _b0);
            _D = _mm_comp_fmadd_ps(_rows1, _b1, _D);
            _D = _mm_comp_fmadd_ps(_rows2, _b2, _D);
            _D = _mm_comp_fmadd_ps(_rows3, _b3, _D);
            _mm_store_ps(Dp, _D);

            Dp += 4;
            rows0p += 4;
            rows1p += 4;
            rows2p += 4;
            rows3p += 4;
        }

        beta += 4;
    }
}